

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O2

void __thiscall Func::NumberInstrs(Func *this)

{
  Instr *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Instr *pIVar4;
  Instr **ppIVar5;
  uint32 number;
  
  if (this->parentFunc != (Func *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x4b4,"(this->IsTopFunc())","this->IsTopFunc()");
    if (!bVar2) goto LAB_0040a539;
    *puVar3 = 0;
  }
  if (this->hasInstrNumber == false) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x4b5,"(!this->hasInstrNumber)","!this->hasInstrNumber");
    if (!bVar2) {
LAB_0040a539:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this->hasInstrNumber = true;
  ppIVar5 = &this->m_headInstr;
  pIVar4 = (Instr *)0x0;
  number = 1;
  do {
    this_00 = *ppIVar5;
    if (this_00 == (Instr *)0x0) {
      return;
    }
    if ((pIVar4 != (Instr *)0x0) && (pIVar4->m_next != this_00)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x4ba,"(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)"
                         ,"Modifying instr list but not using EDITING iterator!");
      if (!bVar2) goto LAB_0040a539;
      *puVar3 = 0;
    }
    IR::Instr::SetNumber(this_00,number);
    ppIVar5 = &this_00->m_next;
    pIVar4 = this_00;
    number = number + 1;
  } while( true );
}

Assistant:

void
Func::NumberInstrs()
{
#if DBG_DUMP
    Assert(this->IsTopFunc());
    Assert(!this->hasInstrNumber);
    this->hasInstrNumber = true;
#endif
    uint instrCount = 1;

    FOREACH_INSTR_IN_FUNC(instr, this)
    {
        instr->SetNumber(instrCount++);
    }
    NEXT_INSTR_IN_FUNC;
}